

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_DsdManCheckDec(If_DsdMan_t *p,int iDsd)

{
  int iVar1;
  int iDsd_local;
  If_DsdMan_t *p_local;
  
  iVar1 = Abc_Lit2Var(iDsd);
  iVar1 = If_DsdVecObjMark(&p->vObjs,iVar1);
  return iVar1;
}

Assistant:

int If_DsdManCheckDec( If_DsdMan_t * p, int iDsd )
{
    return If_DsdVecObjMark( &p->vObjs, Abc_Lit2Var(iDsd) );
}